

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryBase.cpp
# Opt level: O0

void Diligent::VerifyEngineCreateInfo(EngineCreateInfo *EngineCI,GraphicsAdapterInfo *AdapterInfo)

{
  long lVar1;
  reference pvVar2;
  ImmediateContextCreateInfo *ContextInfo;
  undefined1 local_78 [4];
  Uint32 CtxInd;
  array<unsigned_int,_16UL> QueueCount;
  unsigned_long MaxImmediateContexts;
  GraphicsAdapterInfo *local_28;
  GraphicsAdapterInfo *AdapterInfo_local;
  EngineCreateInfo *EngineCI_local;
  
  local_28 = AdapterInfo;
  AdapterInfo_local = (GraphicsAdapterInfo *)EngineCI;
  if (*(int *)EngineCI != 0x3e808) {
    MaxImmediateContexts._4_4_ = 0x3e808;
    LogError<true,char[26],int,char[50],int,char[2]>
              (false,"VerifyEngineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
               ,0x2c,(char (*) [26])"Diligent Engine runtime (",
               (int *)((long)&MaxImmediateContexts + 4),
               (char (*) [50])") is not compatible with the client API version (",(int *)EngineCI,
               (char (*) [2])0xcabce5);
  }
  if ((*(int *)(AdapterInfo_local->Description + 0x18) != 0) !=
      (*(long *)(AdapterInfo_local->Description + 0x10) != 0)) {
    LogError<true,char[67]>
              (false,"VerifyEngineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
               ,0x31,(char (*) [67])
                     "If NumImmediateContexts is not zero, pContextInfo must not be null");
  }
  QueueCount._M_elems[0xe] = 0x40;
  QueueCount._M_elems[0xf] = 0;
  if (0x3f < *(uint *)(AdapterInfo_local->Description + 0x18)) {
    LogError<true,char[23],unsigned_int,char[21],unsigned_long,char[1]>
              (false,"VerifyEngineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
               ,0x39,(char (*) [23])"NumImmediateContexts (",
               (uint *)(AdapterInfo_local->Description + 0x18),(char (*) [21])") must be less than "
               ,(unsigned_long *)(QueueCount._M_elems + 0xe),(char (*) [1])0xc361e0);
  }
  memset(local_78,0,0x40);
  for (ContextInfo._4_4_ = 0; ContextInfo._4_4_ < *(uint *)(AdapterInfo_local->Description + 0x18);
      ContextInfo._4_4_ = ContextInfo._4_4_ + 1) {
    lVar1 = *(long *)(AdapterInfo_local->Description + 0x10) + (ulong)ContextInfo._4_4_ * 0x10;
    if (local_28->NumQueues <= (uint)*(byte *)(lVar1 + 8)) {
      LogError<true,char[14],unsigned_int,char[12],unsigned_char,char[44],unsigned_int,char[3]>
                (false,"VerifyEngineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
                 ,0x44,(char (*) [14])"pContextInfo[",(uint *)((long)&ContextInfo + 4),
                 (char (*) [12])"].QueueId (",(uchar *)(lVar1 + 8),
                 (char (*) [44])") must be less than AdapterInfo.NumQueues (",&local_28->NumQueues,
                 (char (*) [3])0xccce78);
    }
    pvVar2 = std::array<unsigned_int,_16UL>::operator[]
                       ((array<unsigned_int,_16UL> *)local_78,(ulong)*(byte *)(lVar1 + 8));
    *pvVar2 = *pvVar2 + 1;
    pvVar2 = std::array<unsigned_int,_16UL>::operator[]
                       ((array<unsigned_int,_16UL> *)local_78,(ulong)*(byte *)(lVar1 + 8));
    if (local_28->Queues[*(byte *)(lVar1 + 8)].MaxDeviceContexts < *pvVar2) {
      LogError<true,char[14],unsigned_int,char[40],unsigned_char,char[39],unsigned_int,char[2]>
                (false,"VerifyEngineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
                 ,0x4a,(char (*) [14])"pContextInfo[",(uint *)((long)&ContextInfo + 4),
                 (char (*) [40])"]: the number of contexts with QueueId ",(uchar *)(lVar1 + 8),
                 (char (*) [39])" exceeds the maximum available number ",
                 &local_28->Queues[*(byte *)(lVar1 + 8)].MaxDeviceContexts,(char (*) [2])0xcca6b6);
    }
    if (3 < *(byte *)(lVar1 + 9) - 1) {
      LogError<true,char[23]>
                (false,"VerifyEngineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
                 ,0x55,(char (*) [23])"Unknown queue priority");
    }
  }
  if (((*(long *)(AdapterInfo_local->Description + 0x70) != 0) &&
      (*(long *)(*(long *)(AdapterInfo_local->Description + 0x70) + 8) != 0)) &&
     (**(long **)(AdapterInfo_local->Description + 0x70) == 0)) {
    LogError<true,char[85]>
              (false,"VerifyEngineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
               ,0x5d,(char (*) [85])
                     "pXRAttribs->GetInstanceProcAddr must not be null if pXRAttribs->Instance is not null"
              );
  }
  return;
}

Assistant:

void VerifyEngineCreateInfo(const EngineCreateInfo& EngineCI, const GraphicsAdapterInfo& AdapterInfo) noexcept(false)
{
    if (EngineCI.EngineAPIVersion != DILIGENT_API_VERSION)
    {
        LOG_ERROR_AND_THROW("Diligent Engine runtime (", DILIGENT_API_VERSION, ") is not compatible with the client API version (", EngineCI.EngineAPIVersion, ")");
    }

    if ((EngineCI.NumImmediateContexts > 0) != (EngineCI.pImmediateContextInfo != nullptr))
    {
        LOG_ERROR_AND_THROW("If NumImmediateContexts is not zero, pContextInfo must not be null");
    }

    constexpr auto MaxImmediateContexts = 8 * std::min(sizeof(decltype(BufferDesc::ImmediateContextMask)), sizeof(decltype(TextureDesc::ImmediateContextMask)));
    static_assert(MAX_COMMAND_QUEUES == MaxImmediateContexts, "Number of bits in MaxImmediateContexts must be equal to MAX_COMMAND_QUEUES");

    if (EngineCI.NumImmediateContexts >= MaxImmediateContexts)
    {
        LOG_ERROR_AND_THROW("NumImmediateContexts (", EngineCI.NumImmediateContexts, ") must be less than ", MaxImmediateContexts, "");
    }

    std::array<Uint32, DILIGENT_MAX_ADAPTER_QUEUES> QueueCount = {};
    for (Uint32 CtxInd = 0; CtxInd < EngineCI.NumImmediateContexts; ++CtxInd)
    {
        const auto& ContextInfo = EngineCI.pImmediateContextInfo[CtxInd];

        if (ContextInfo.QueueId >= AdapterInfo.NumQueues)
        {
            LOG_ERROR_AND_THROW("pContextInfo[", CtxInd, "].QueueId (", ContextInfo.QueueId, ") must be less than AdapterInfo.NumQueues (",
                                AdapterInfo.NumQueues, ").");
        }
        QueueCount[ContextInfo.QueueId] += 1;
        if (QueueCount[ContextInfo.QueueId] > AdapterInfo.Queues[ContextInfo.QueueId].MaxDeviceContexts)
        {
            LOG_ERROR_AND_THROW("pContextInfo[", CtxInd, "]: the number of contexts with QueueId ", ContextInfo.QueueId,
                                " exceeds the maximum available number ", AdapterInfo.Queues[ContextInfo.QueueId].MaxDeviceContexts, ".");
        }

        switch (ContextInfo.Priority)
        {
            case QUEUE_PRIORITY_LOW:
            case QUEUE_PRIORITY_MEDIUM:
            case QUEUE_PRIORITY_HIGH:
            case QUEUE_PRIORITY_REALTIME:
                break;
            default:
                LOG_ERROR_AND_THROW("Unknown queue priority");
        }
    }

    if (EngineCI.pXRAttribs != nullptr && EngineCI.pXRAttribs->Instance != 0)
    {
        if (EngineCI.pXRAttribs->GetInstanceProcAddr == nullptr)
        {
            LOG_ERROR_AND_THROW("pXRAttribs->GetInstanceProcAddr must not be null if pXRAttribs->Instance is not null");
        }
    }
}